

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseStageMeta
          (AsciiParser *this,pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *out)

{
  char *pcVar1;
  bool bVar2;
  const_iterator cVar3;
  long *plVar4;
  ostream *poVar5;
  size_type *psVar6;
  ListEditQual qual;
  string varname;
  value_type vardef;
  MetaVariable var;
  optional<tinyusdz::ascii::AsciiParser::VariableDef> pvardef;
  ListEditQual local_26c;
  string local_268;
  undefined1 local_248 [8];
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_230 [5];
  storage_union local_1d8;
  undefined **local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined8 local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  ostringstream local_1a0 [8];
  VariableDef local_198;
  ios_base local_130 [264];
  
  bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar2) {
    return false;
  }
  local_26c = ResetToExplicit;
  bVar2 = MaybeListEditQual(this,&local_26c);
  if (!bVar2) {
    return false;
  }
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (!bVar2) {
    return false;
  }
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  bVar2 = ReadIdentifier(this,&local_268);
  if (bVar2) {
    cVar3 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
            ::find(&(this->_supported_stage_metas)._M_t,&local_268);
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"ParseStageMeta",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a0,0xbe0);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1d8,"Unsupported or invalid/empty variable name `",&local_268);
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1d8);
      pcVar1 = local_240 + 8;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        local_240._8_8_ = *psVar6;
        aaStack_230[0]._0_8_ = plVar4[3];
        local_248 = (undefined1  [8])pcVar1;
      }
      else {
        local_240._8_8_ = *psVar6;
        local_248 = (undefined1  [8])*plVar4;
      }
      local_240._0_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar4 + 1);
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(char *)local_248,local_240._0_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if (local_248 != (undefined1  [8])pcVar1) {
        operator_delete((void *)local_248,local_240._8_8_ + 1);
      }
      if ((undefined ***)local_1d8.dynamic != &local_1c8) {
        operator_delete(local_1d8.dynamic,(long)local_1c8 + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_248);
      if (local_248 != (undefined1  [8])pcVar1) {
LAB_00348ac8:
        operator_delete((void *)local_248,local_240._8_8_ + 1);
      }
LAB_00348ad5:
      ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
      ::std::ios_base::~ios_base(local_130);
    }
    else {
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (bVar2) {
        bVar2 = Expect(this,'=');
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,"ParseStageMeta",0xe);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
          poVar5 = (ostream *)::std::ostream::operator<<(local_1a0,0xbe8);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,"`=` expected.",0xd);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_248);
          if (local_248 != (undefined1  [8])(local_240 + 8)) goto LAB_00348ac8;
          goto LAB_00348ad5;
        }
        bVar2 = SkipWhitespaceAndNewline(this,true);
        if (bVar2) {
          GetStageMetaDefinition
                    ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)local_248,this,
                     &local_268);
          local_1a0[0] = local_248[0];
          if (local_248[0] == (ostringstream)0x1) {
            VariableDef::VariableDef(&local_198,(VariableDef *)local_240);
          }
          if (local_248[0] == (ostringstream)0x1) {
            nonstd::optional_lite::detail::storage_t<tinyusdz::ascii::AsciiParser::VariableDef>::
            destruct_value((storage_t<tinyusdz::ascii::AsciiParser::VariableDef> *)local_240);
          }
          if (local_1a0[0] == (ostringstream)0x1) {
            VariableDef::VariableDef((VariableDef *)local_248,&local_198);
            local_1c0 = &local_1b0;
            local_1c8 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_1d8.dynamic = (undefined ***)0x0;
            local_1b8 = 0;
            local_1b0._M_local_buf[0] = '\0';
            bVar2 = ParseMetaValue(this,(VariableDef *)local_248,(MetaVariable *)&local_1d8);
            if (bVar2) {
              ::std::__cxx11::string::_M_assign((string *)&local_1c0);
              out->first = local_26c;
              ::std::__cxx11::string::_M_assign((string *)&(out->second)._name);
              linb::any::operator=((any *)&out->second,(any *)&local_1d8);
            }
            MetaVariable::~MetaVariable((MetaVariable *)&local_1d8);
            VariableDef::~VariableDef((VariableDef *)local_248);
          }
          else {
            bVar2 = false;
          }
          if (local_1a0[0] == (ostringstream)0x1) {
            nonstd::optional_lite::detail::storage_t<tinyusdz::ascii::AsciiParser::VariableDef>::
            destruct_value((storage_t<tinyusdz::ascii::AsciiParser::VariableDef> *)&local_198);
          }
          goto LAB_00348af8;
        }
      }
    }
  }
  bVar2 = false;
LAB_00348af8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ParseStageMeta(std::pair<ListEditQual, MetaVariable> *out) {
  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  tinyusdz::ListEditQual qual{ListEditQual::ResetToExplicit};
  if (!MaybeListEditQual(&qual)) {
    return false;
  }

  DCOUT("list-edit qual: " << tinyusdz::to_string(qual));

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::string varname;
  if (!ReadIdentifier(&varname)) {
    return false;
  }

  // std::cout << "varname = `" << varname << "`\n";

  if (!IsStageMeta(varname)) {
    PUSH_ERROR_AND_RETURN("Unsupported or invalid/empty variable name `" +
                          varname + "` for Stage metadatum");
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect('=')) {
    PUSH_ERROR_AND_RETURN("`=` expected.");
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  auto pvardef = GetStageMetaDefinition(varname);
  if (!pvardef) {
    // This should not happen though;
    return false;
  }

  auto vardef = (*pvardef);

  MetaVariable var;
  if (!ParseMetaValue(vardef, &var)) {
    return false;
  }
  var.set_name(varname);

  std::get<0>(*out) = qual;
  std::get<1>(*out) = var;

  return true;
}